

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong mkvparser::ReadUInt(IMkvReader *pReader,longlong pos,long *len)

{
  int iVar1;
  ulong in_RAX;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uStack_38;
  uchar b;
  
  if (pos < 0 || pReader == (IMkvReader *)0x0) {
    return -2;
  }
  *len = 1;
  uStack_38 = in_RAX;
  iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,1,&b);
  if (-1 < iVar1) {
    if (iVar1 != 0) {
      return -3;
    }
    if (b == '\0') {
      return -2;
    }
    lVar2 = *len;
    for (uVar4 = 0x80; (uVar4 & b) == 0; uVar4 = uVar4 >> 1) {
      lVar2 = lVar2 + 1;
      *len = lVar2;
    }
    uVar5 = (ulong)(~uVar4 & (uint)b);
    lVar3 = 1;
    while( true ) {
      if (lVar2 <= lVar3) {
        return uVar5;
      }
      iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos + lVar3,1,&b);
      if (iVar1 < 0) break;
      if (iVar1 != 0) {
        *len = 1;
        return -3;
      }
      uVar5 = uVar5 << 8 | uStack_38 >> 0x38;
      lVar3 = lVar3 + 1;
      lVar2 = *len;
    }
    *len = 1;
  }
  return (long)iVar1;
}

Assistant:

long long ReadUInt(IMkvReader* pReader, long long pos, long& len) {
  if (!pReader || pos < 0)
    return E_FILE_FORMAT_INVALID;

  len = 1;
  unsigned char b;
  int status = pReader->Read(pos, 1, &b);

  if (status < 0)  // error or underflow
    return status;

  if (status > 0)  // interpreted as "underflow"
    return E_BUFFER_NOT_FULL;

  if (b == 0)  // we can't handle u-int values larger than 8 bytes
    return E_FILE_FORMAT_INVALID;

  unsigned char m = 0x80;

  while (!(b & m)) {
    m >>= 1;
    ++len;
  }

  long long result = b & (~m);
  ++pos;

  for (int i = 1; i < len; ++i) {
    status = pReader->Read(pos, 1, &b);

    if (status < 0) {
      len = 1;
      return status;
    }

    if (status > 0) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result <<= 8;
    result |= b;

    ++pos;
  }

  return result;
}